

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBezierCurve.cpp
# Opt level: O1

void chrono::ChBezierCurve::solveTriDiag(size_t n,double *rhs,double *x)

{
  undefined1 auVar1 [16];
  void *pvVar2;
  ulong uVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  
  pvVar2 = operator_new__(-(ulong)(n >> 0x3d != 0) | n * 8);
  *x = *rhs * 0.5;
  if (1 < n) {
    dVar4 = *x;
    dVar7 = 2.0;
    uVar3 = 1;
    do {
      *(double *)((long)pvVar2 + uVar3 * 8) = 1.0 / dVar7;
      dVar7 = *(double *)(&DAT_009808c0 + (ulong)(uVar3 < n - 1) * 8) - 1.0 / dVar7;
      dVar4 = (rhs[uVar3] - dVar4) / dVar7;
      x[uVar3] = dVar4;
      uVar3 = uVar3 + 1;
    } while (n != uVar3);
  }
  if (1 < n) {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = x[n - 1];
    do {
      auVar6._8_8_ = 0;
      auVar6._0_8_ = *(ulong *)((long)pvVar2 + n * 8 + -8);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = x[n - 2];
      auVar5 = vfnmadd213sd_fma(auVar5,auVar6,auVar1);
      x[n - 2] = auVar5._0_8_;
      n = n - 1;
    } while (n != 1);
  }
  operator_delete__(pvVar2);
  return;
}

Assistant:

void ChBezierCurve::solveTriDiag(size_t n, double* rhs, double* x) {
    double* tmp = new double[n];

    double b = 2.0;
    x[0] = rhs[0] / b;

    // Decomposition and forward substitution.
    for (size_t i = 1; i < n; i++) {
        tmp[i] = 1 / b;
        b = (i < n - 1 ? 4.0 : 3.5) - tmp[i];
        x[i] = (rhs[i] - x[i - 1]) / b;
    }

    // Backsubstitution.
    for (size_t i = 1; i < n; i++)
        x[n - i - 1] -= tmp[n - i] * x[n - i];

    delete[] tmp;
}